

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit_editor.cpp
# Opt level: O0

ModelWire * __thiscall
lsim::gui::CircuitEditor::ui_try_merge_wire_segment(CircuitEditor *this,ModelWireSegment *segment)

{
  ModelCircuit *this_00;
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  ModelWireJunction *pMVar4;
  Point *pPVar5;
  wire_lut_t *this_01;
  reference pvVar6;
  Point this_02;
  ModelWire *this_03;
  Point local_90;
  int local_70;
  int w;
  bool merged;
  ModelWire *wire_to_merge;
  pointer wire;
  value_type *iter;
  const_iterator __end2;
  const_iterator __begin2;
  wire_lut_t *__range2;
  Point end_points [2];
  ModelWire *target_wires [2];
  ModelWireSegment *segment_local;
  CircuitEditor *this_local;
  
  memset(end_points + 1,0,0x10);
  pMVar4 = ModelWireSegment::junction(segment,0);
  pPVar5 = ModelWireJunction::position(pMVar4);
  __range2 = *(wire_lut_t **)pPVar5;
  pMVar4 = ModelWireSegment::junction(segment,1);
  pPVar5 = ModelWireJunction::position(pMVar4);
  end_points[0] = *pPVar5;
  this_01 = ModelCircuit::wires(this->m_model_circuit);
  __end2 = std::
           unordered_map<unsigned_int,_std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>_>_>_>
           ::begin(this_01);
  iter = (value_type *)
         std::
         unordered_map<unsigned_int,_std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>_>_>_>
         ::end(this_01);
  while (bVar1 = std::__detail::operator!=
                           (&__end2.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>_>,_false>
                            ,(_Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>_>,_false>
                              *)&iter), bVar1) {
    pvVar6 = std::__detail::
             _Node_const_iterator<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>_>,_false,_false>
             ::operator*(&__end2);
    this_02 = (Point)std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>::get
                               (&pvVar6->second);
    uVar3 = ModelWire::id((ModelWire *)this_02);
    this_03 = ModelWireSegment::wire(segment);
    uVar2 = ModelWire::id(this_03);
    if (uVar3 < uVar2) {
      if ((end_points[1] == (Point)0x0) &&
         (bVar1 = ModelWire::point_on_wire((ModelWire *)this_02,(Point *)&__range2), bVar1)) {
        ModelWire::split_at_new_junction((ModelWire *)this_02,(Point *)&__range2);
        end_points[1] = this_02;
      }
      else if ((target_wires[0] == (ModelWire *)0x0) &&
              (bVar1 = ModelWire::point_on_wire((ModelWire *)this_02,end_points), bVar1)) {
        ModelWire::split_at_new_junction((ModelWire *)this_02,end_points);
        target_wires[0] = (ModelWire *)this_02;
      }
      if ((end_points[1] != (Point)0x0) && (target_wires[0] != (ModelWire *)0x0)) break;
    }
    std::__detail::
    _Node_const_iterator<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>_>,_false,_false>
    ::operator++(&__end2);
  }
  _w = (Point)ModelWireSegment::wire(segment);
  bVar1 = false;
  for (local_70 = 1; -1 < local_70; local_70 = local_70 + -1) {
    if (end_points[(long)local_70 + 1] != (Point)0x0) {
      ModelWire::merge((ModelWire *)end_points[(long)local_70 + 1],(ModelWire *)_w);
      this_00 = this->m_model_circuit;
      uVar3 = ModelWire::id((ModelWire *)_w);
      ModelCircuit::remove_wire(this_00,uVar3);
      _w = end_points[(long)local_70 + 1];
      bVar1 = true;
    }
  }
  if (bVar1) {
    local_90 = _w;
  }
  else {
    local_90 = (Point)ModelWireSegment::wire(segment);
  }
  return (ModelWire *)local_90;
}

Assistant:

ModelWire* CircuitEditor::ui_try_merge_wire_segment(ModelWireSegment* segment) {

	ModelWire* target_wires[2] = { nullptr, nullptr };
	Point end_points[2] = { segment->junction(0)->position(), segment->junction(1)->position() };

	for (auto& iter : m_model_circuit->wires()) {
		auto wire = iter.second.get();
		if (wire->id() >= segment->wire()->id()) {
			continue;
		}
			
		if (target_wires[0] == nullptr && wire->point_on_wire(end_points[0])) {
			wire->split_at_new_junction(end_points[0]);
			target_wires[0] = wire;
		} else if (target_wires[1] == nullptr && wire->point_on_wire(end_points[1])) {
			wire->split_at_new_junction(end_points[1]);
			target_wires[1] = wire;
		}

		if (target_wires[0] != nullptr && target_wires[1] != nullptr) {
			break;
		}
	}

	auto wire_to_merge = segment->wire();
	bool merged = false;
	for (int w = 1; w >= 0; --w) {
		if (target_wires[w] != nullptr) {
			target_wires[w]->merge(wire_to_merge);
			m_model_circuit->remove_wire(wire_to_merge->id());
			wire_to_merge = target_wires[w];
			merged = true;
		}
	}

	return (merged) ? wire_to_merge : segment->wire();
}